

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
ser::MetainfoSet::types(vector<int,_std::allocator<int>_> *__return_storage_ptr__,MetainfoSet *this)

{
  bool bVar1;
  size_type __n;
  pointer ppVar2;
  type_info *ptVar3;
  ostream *poVar4;
  any *operand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  value_type_conflict3 local_54 [5];
  _Self local_40;
  _Self local_38;
  const_iterator iter;
  MetainfoSet *this_local;
  vector<int,_std::allocator<int>_> *ret;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  __n = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
        ::size(&this->data_);
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,__n);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
       ::begin(&this->data_);
  do {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
         ::end(&this->data_);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
             ::operator->(&local_38);
    ptVar3 = boost::any::type(&ppVar2->second);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&bool::typeinfo);
    if (bVar1) {
      local_54[4] = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,local_54 + 4);
    }
    else {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
               ::operator->(&local_38);
      ptVar3 = boost::any::type(&ppVar2->second);
      bVar1 = std::type_info::operator==(ptVar3,(type_info *)&int::typeinfo);
      if (bVar1) {
        local_54[3] = 0xfffffffe;
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,local_54 + 3);
      }
      else {
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
                 ::operator->(&local_38);
        ptVar3 = boost::any::type(&ppVar2->second);
        bVar1 = std::type_info::operator==(ptVar3,(type_info *)&float::typeinfo);
        if (bVar1) {
          local_54[2] = 0xfffffffd;
          std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,local_54 + 2);
        }
        else {
          ppVar2 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
                   ::operator->(&local_38);
          ptVar3 = boost::any::type(&ppVar2->second);
          bVar1 = std::type_info::operator==(ptVar3,(type_info *)&double::typeinfo);
          if (bVar1) {
            local_54[1] = 0xfffffffc;
            std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,local_54 + 1);
          }
          else {
            ppVar2 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
                     ::operator->(&local_38);
            ptVar3 = boost::any::type(&ppVar2->second);
            bVar1 = std::type_info::operator==(ptVar3,(type_info *)&std::__cxx11::string::typeinfo);
            if (!bVar1) {
              poVar4 = std::operator<<((ostream *)&std::cout,"Error: type of metainfo ");
              ppVar2 = std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
                       ::operator->(&local_38);
              poVar4 = std::operator<<(poVar4,(string *)ppVar2);
              std::operator<<(poVar4," is not supported\n");
              exit(1);
            }
            ppVar2 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
                     ::operator->(&local_38);
            boost::any_cast<std::__cxx11::string>(&local_78,(boost *)&ppVar2->second,operand);
            local_54[0] = std::__cxx11::string::size();
            std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,local_54);
            std::__cxx11::string::~string((string *)&local_78);
          }
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

std::vector<int> MetainfoSet::types() const
{
    std::vector<int> ret;
    ret.reserve(data_.size());
    for (std::map<std::string, boost::any>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        if (iter->second.type() == typeid(bool))
            ret.push_back(-1);
        else if (iter->second.type() == typeid(int))
            ret.push_back(-2);
        else if (iter->second.type() == typeid(float))
            ret.push_back(-3);
        else if (iter->second.type() == typeid(double))
            ret.push_back(-4);
        else if (iter->second.type() == typeid(std::string))
            ret.push_back(boost::any_cast<std::string>(iter->second).size());
        else
        {
            std::cout << "Error: type of metainfo " << iter->first << " is not supported\n";
            std::exit(1);
        }
    }
    return ret;
}